

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall
ncnn::Interp::eval_size_expr
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,int *outw,
          int *outh)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  vector<int,_std::allocator<int>_> sizes;
  
  sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1 = eval_list_expression(&this->size_expr,bottom_blobs,&sizes);
  iVar2 = -1;
  if (iVar1 == 0) {
    if ((sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) &&
       ((ulong)((long)sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) < 9)) {
      piVar3 = &((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start)->h;
      if ((long)sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start != 4) {
        piVar3 = sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start + 1;
      }
      *outw = *sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *outh = *piVar3;
      iVar2 = 0;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sizes.super__Vector_base<int,_std::allocator<int>_>);
  return iVar2;
}

Assistant:

int Interp::eval_size_expr(const std::vector<Mat>& bottom_blobs, int& outw, int& outh) const
{
    // [size(@0,0),size(@0,1)]
    std::vector<int> sizes;
    int er = eval_list_expression(size_expr, bottom_blobs, sizes);
    if (er != 0)
        return -1;

    if (sizes.empty() || sizes.size() > 2)
        return -1;

    if (sizes.size() == 1)
    {
        outw = sizes[0];
        outh = bottom_blobs[0].h;
    }
    else
    {
        outw = sizes[0];
        outh = sizes[1];
    }

    return 0;
}